

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::SelectFlatLoop<double,double,duckdb::GreaterThan,true,false,true,true>
                (double *ldata,double *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  idx_t iVar10;
  long lVar11;
  
  uVar5 = 0;
  uVar7 = 0;
  lVar11 = 0;
  iVar10 = 0;
  do {
    if (uVar5 == count + 0x3f >> 6) {
      return iVar10;
    }
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    if (puVar1 == (unsigned_long *)0x0) {
      uVar9 = uVar7 + 0x40;
      if (count <= uVar7 + 0x40) {
        uVar9 = count;
      }
LAB_013e6681:
      pdVar8 = rdata + uVar7;
      for (; uVar6 = uVar7, uVar7 < uVar9; uVar7 = uVar7 + 1) {
        uVar3 = uVar7;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar3 = (ulong)sel->sel_vector[uVar7];
        }
        bVar2 = GreaterThan::Operation<double>(ldata,pdVar8);
        true_sel->sel_vector[iVar10] = (sel_t)uVar3;
        iVar10 = iVar10 + bVar2;
        false_sel->sel_vector[lVar11] = (sel_t)uVar3;
        lVar11 = lVar11 + (ulong)!bVar2;
        pdVar8 = pdVar8 + 1;
      }
    }
    else {
      uVar3 = puVar1[uVar5];
      uVar9 = uVar7 + 0x40;
      if (count <= uVar7 + 0x40) {
        uVar9 = count;
      }
      if (uVar3 == 0xffffffffffffffff) goto LAB_013e6681;
      if (uVar3 == 0) {
        for (; uVar6 = uVar9, uVar7 < uVar9; uVar7 = uVar7 + 1) {
          uVar3 = uVar7;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar3 = (ulong)sel->sel_vector[uVar7];
          }
          false_sel->sel_vector[lVar11] = (sel_t)uVar3;
          lVar11 = lVar11 + 1;
        }
      }
      else {
        pdVar8 = rdata + uVar7;
        uVar4 = 0;
        for (; uVar6 = uVar7, uVar7 < uVar9; uVar7 = uVar7 + 1) {
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar6 = (ulong)sel->sel_vector[uVar7];
          }
          if ((uVar3 >> (uVar4 & 0x3f) & 1) == 0) {
            bVar2 = false;
          }
          else {
            bVar2 = GreaterThan::Operation<double>(ldata,pdVar8);
          }
          true_sel->sel_vector[iVar10] = (sel_t)uVar6;
          iVar10 = iVar10 + bVar2;
          false_sel->sel_vector[lVar11] = (sel_t)uVar6;
          lVar11 = lVar11 + (ulong)(bVar2 ^ 1);
          uVar4 = uVar4 + 1;
          pdVar8 = pdVar8 + 1;
        }
      }
    }
    uVar7 = uVar6;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}